

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

void __thiscall mjs::error_object::rethrow(error_object *this)

{
  native_error_type type;
  gc_heap *h_00;
  native_error_exception *this_00;
  gc_string *this_01;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_90;
  value local_80;
  string local_58;
  wstring_view local_48 [2];
  wstring_view local_28;
  gc_heap *local_18;
  gc_heap *h;
  error_object *this_local;
  
  h = (gc_heap *)this;
  local_18 = object::heap((object *)this);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  type = *(native_error_type *)&(this->super_native_object).field_0x24;
  this_01 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&this->stack_trace_,local_18);
  local_28 = gc_string::view(this_01);
  h_00 = local_18;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_90,L"message");
  (**(this->super_native_object).super_object._vptr_object)(&local_80,this,&local_90);
  mjs::to_string((mjs *)&local_58,h_00,&local_80);
  local_48[0] = string::view(&local_58);
  native_error_exception::native_error_exception(this_00,type,&local_28,local_48);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

[[noreturn]] void rethrow() const {
        auto& h = heap();
        throw native_error_exception{type_, stack_trace_.dereference(h).view(), mjs::to_string(h, get(L"message")).view()};
    }